

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlnumber.c
# Opt level: O0

filepos_t UpdateSizeSignedInt(ebml_integer *Element,bool_t bWithDefault,
                             bool_t bForceWithoutMandatory,int ForProfile)

{
  long lVar1;
  void *pvVar2;
  filepos_t fVar3;
  int ForProfile_local;
  bool_t bForceWithoutMandatory_local;
  bool_t bWithDefault_local;
  ebml_integer *Element_local;
  
  if (Element == (ebml_integer *)0x0) {
    __assert_fail("(const void*)(Element)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlnumber.c"
                  ,0x10a,"filepos_t UpdateSizeSignedInt(ebml_integer *, bool_t, bool_t, int)");
  }
  lVar1 = (**(code **)((long)(Element->Base).Base.Base.VMT + 0xa0))(Element,bWithDefault);
  if (lVar1 != 0) {
    if ((Element->Value < 0x80) && (-0x81 < Element->Value)) {
      (Element->Base).DataSize = 1;
    }
    else if ((Element->Value < 0x8000) && (-0x8001 < Element->Value)) {
      (Element->Base).DataSize = 2;
    }
    else if ((Element->Value < 0x800000) && (-0x800001 < Element->Value)) {
      (Element->Base).DataSize = 3;
    }
    else if ((Element->Value < 0x80000000) && (-0x80000001 < Element->Value)) {
      (Element->Base).DataSize = 4;
    }
    else if ((Element->Value < 0x8000000000) && (-0x8000000001 < Element->Value)) {
      (Element->Base).DataSize = 5;
    }
    else if ((Element->Value < 0x800000000000) && (-0x800000000001 < Element->Value)) {
      (Element->Base).DataSize = 6;
    }
    else if ((Element->Value < 0x80000000000000) && (-0x80000000000001 < Element->Value)) {
      (Element->Base).DataSize = 7;
    }
    else {
      (Element->Base).DataSize = 8;
    }
  }
  pvVar2 = Node_InheritedVMT((node *)Element,0x49534245);
  fVar3 = (**(code **)((long)pvVar2 + 0x98))(Element,bWithDefault,bForceWithoutMandatory,ForProfile)
  ;
  return fVar3;
}

Assistant:

static filepos_t UpdateSizeSignedInt(ebml_integer *Element, bool_t bWithDefault, bool_t bForceWithoutMandatory, int ForProfile)
{
    if (EBML_ElementNeedsDataSizeUpdate(Element, bWithDefault))
    {
        if (Element->Value <= 0x7F && Element->Value >= (-0x80)) {
            Element->Base.DataSize = 1;
        } else if (Element->Value <= 0x7FFF && Element->Value >= (-0x8000)) {
            Element->Base.DataSize = 2;
        } else if (Element->Value <= 0x7FFFFF && Element->Value >= (-0x800000)) {
            Element->Base.DataSize = 3;
        } else if (Element->Value <= (int64_t)(0x7FFFFFFF) && Element->Value >= -(int64_t)(0x80000000)) {
            Element->Base.DataSize = 4;
        } else if (Element->Value <= 0x7FFFFFFFFF && Element->Value >= (-0x8000000000)) {
            Element->Base.DataSize = 5;
        } else if (Element->Value <= 0x7FFFFFFFFFFF && Element->Value >= (-0x800000000000)) {
            Element->Base.DataSize = 6;
        } else if (Element->Value <= 0x7FFFFFFFFFFFFF && Element->Value >= (-0x80000000000000)) {
            Element->Base.DataSize = 7;
        } else
            Element->Base.DataSize = 8;
    }

    return INHERITED(Element,ebml_element_vmt,EBML_SINTEGER_CLASS)->UpdateDataSize(Element, bWithDefault, bForceWithoutMandatory, ForProfile);
}